

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.hpp
# Opt level: O0

void __thiscall inja::Template::Template(Template *this,string *content)

{
  string *content_local;
  Template *this_local;
  
  BlockNode::BlockNode(&this->root);
  ::std::__cxx11::string::string((string *)&this->content,(string *)content);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  ::map(&this->block_storage);
  return;
}

Assistant:

explicit Template(std::string content): content(std::move(content)) {}